

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameTitle.cpp
# Opt level: O0

void __thiscall GameTitle::moveInText(GameTitle *this,Screen *screen,int color)

{
  int iVar1;
  int iVar2;
  int start;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [48];
  string local_88 [32];
  int local_68;
  int local_64;
  int fourthWordEndLocation [2];
  int fourthWordStartLocation [2];
  int thirdWordEndLocation [2];
  int thirdWordStartLocation [2];
  int secondWordEndLocation [2];
  int secondWordStartLocation [2];
  int firstWordEndLocation [2];
  int firstWordStartLocation [2];
  int totalAnimationFrames;
  uint frameCounter;
  int animationLength;
  int color_local;
  Screen *screen_local;
  GameTitle *this_local;
  
  firstWordStartLocation[1] = 0;
  (this->firstWord).screenLocation[0] = 0;
  iVar1 = Screen::getScreenSizeX(screen);
  iVar2 = std::__cxx11::string::length();
  (this->firstWord).screenLocation[1] = iVar1 - iVar2;
  (this->secondWord).screenLocation[0] = 0;
  (this->secondWord).screenLocation[1] = 0;
  start = Screen::getScreenSizeY(screen);
  (this->thirdWord).screenLocation[0] = start;
  iVar3 = Screen::getScreenSizeX(screen);
  iVar4 = std::__cxx11::string::length();
  (this->thirdWord).screenLocation[1] = iVar3 - iVar4;
  fourthWordEndLocation[0] = Screen::getScreenSizeY(screen);
  (this->fourthWord).screenLocation[0] = fourthWordEndLocation[0];
  (this->fourthWord).screenLocation[1] = 0;
  fourthWordEndLocation[1] = 0;
  iVar5 = Screen::getScreenSizeY(screen);
  iVar5 = iVar5 / 2;
  local_68 = iVar5;
  iVar6 = Screen::getScreenSizeX(screen);
  iVar7 = std::__cxx11::string::length();
  iVar6 = iVar6 / 2 - iVar7 / 2;
  iVar7 = std::__cxx11::string::length();
  iVar7 = iVar6 + iVar7;
  iVar8 = std::__cxx11::string::length();
  iVar8 = iVar7 + iVar8;
  local_64 = std::__cxx11::string::length();
  local_64 = iVar8 + local_64;
  for (; firstWordStartLocation[1] < 0x31; firstWordStartLocation[1] = firstWordStartLocation[1] + 1
      ) {
    Screen::clearScreen(screen);
    std::__cxx11::string::string(local_88,(string *)&this->firstWord);
    Screen::printString(screen,(string *)local_88,(this->firstWord).screenLocation[0],
                        (this->firstWord).screenLocation[1]);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::string(local_b8,(string *)&this->secondWord);
    Screen::printString(screen,(string *)local_b8,(this->secondWord).screenLocation[0],
                        (this->secondWord).screenLocation[1]);
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::string(local_d8,(string *)&this->thirdWord);
    Screen::printString(screen,(string *)local_d8,(this->thirdWord).screenLocation[0],
                        (this->thirdWord).screenLocation[1]);
    std::__cxx11::string::~string(local_d8);
    std::__cxx11::string::string(local_f8,(string *)&this->fourthWord);
    Screen::printString(screen,(string *)local_f8,(this->fourthWord).screenLocation[0],
                        (this->fourthWord).screenLocation[1]);
    std::__cxx11::string::~string(local_f8);
    Screen::refreshScreen(screen);
    usleep(0xa2c2);
    iVar9 = calculateNewPosition(this,(this->firstWord).screenLocation[0],2,0,iVar5,true);
    (this->firstWord).screenLocation[0] = iVar9;
    iVar9 = calculateNewPosition
                      (this,(this->firstWord).screenLocation[1],2,iVar1 - iVar2,iVar6,false);
    (this->firstWord).screenLocation[1] = iVar9;
    iVar9 = calculateNewPosition(this,(this->secondWord).screenLocation[0],2,0,iVar5,true);
    (this->secondWord).screenLocation[0] = iVar9;
    iVar9 = calculateNewPosition(this,(this->secondWord).screenLocation[1],2,0,iVar7,true);
    (this->secondWord).screenLocation[1] = iVar9;
    iVar9 = calculateNewPosition(this,(this->thirdWord).screenLocation[0],2,start,iVar5,false);
    (this->thirdWord).screenLocation[0] = iVar9;
    iVar9 = calculateNewPosition
                      (this,(this->thirdWord).screenLocation[1],2,iVar3 - iVar4,iVar8,false);
    (this->thirdWord).screenLocation[1] = iVar9;
    iVar9 = calculateNewPosition
                      (this,(this->fourthWord).screenLocation[0],2,fourthWordEndLocation[0],local_68
                       ,false);
    (this->fourthWord).screenLocation[0] = iVar9;
    iVar9 = calculateNewPosition
                      (this,(this->fourthWord).screenLocation[1],2,fourthWordEndLocation[1],local_64
                       ,true);
    (this->fourthWord).screenLocation[1] = iVar9;
  }
  return;
}

Assistant:

void GameTitle::moveInText(Screen &screen, int color) {
    int animationLength = 2;
    unsigned int frameCounter = 0;
    int totalAnimationFrames = animationLength * FRAMES_PER_SECOND;
    int firstWordStartLocation[2];
    int firstWordEndLocation[2];
    int secondWordStartLocation[2];
    int secondWordEndLocation[2];
    int thirdWordStartLocation[2];
    int thirdWordEndLocation[2];
    int fourthWordStartLocation[2];
    int fourthWordEndLocation[2];

    // Set the initial locations of the text
    firstWordStartLocation[0] = firstWord.screenLocation[0] = 0;
    firstWordStartLocation[1] = firstWord.screenLocation[1] = screen.getScreenSizeX() - static_cast<int>(firstWord.text.length());

    secondWordStartLocation[0] = secondWord.screenLocation[0] = 0;
    secondWordStartLocation[1] = secondWord.screenLocation[1] = 0;

    thirdWordStartLocation[0] = thirdWord.screenLocation[0] = screen.getScreenSizeY();
    thirdWordStartLocation[1] = thirdWord.screenLocation[1] = screen.getScreenSizeX() - static_cast<int>(thirdWord.text.length());

    fourthWordStartLocation[0] = fourthWord.screenLocation[0] = screen.getScreenSizeY();
    fourthWordStartLocation[1] = fourthWord.screenLocation[1] = 0;

    // Calculate the end positions of the text
    firstWordEndLocation[0] = secondWordEndLocation[0] = thirdWordEndLocation[0] = fourthWordEndLocation[0] = (screen.getScreenSizeY() / 2);

    firstWordEndLocation[1] = ( screen.getScreenSizeX() / 2 ) - ( static_cast<int>( title.length() ) / 2 );
    secondWordEndLocation[1] = firstWordEndLocation[1] + static_cast<int>( firstWord.text.length() );
    thirdWordEndLocation[1] = secondWordEndLocation[1] + static_cast<int>( secondWord.text.length() );
    fourthWordEndLocation[1] = thirdWordEndLocation[1] + static_cast<int>( thirdWord.text.length() );

    // Turn on the color attribute
    //screen.turnAttrOn(COLOR_PAIR(color));

    // Loop through the words until they are all in their respective end positions
    while(static_cast<int>(frameCounter) <= totalAnimationFrames){
        // Print the words on the screen
        screen.clearScreen();
        screen.printString(firstWord.text, firstWord.screenLocation[0], firstWord.screenLocation[1]);
        screen.printString(secondWord.text, secondWord.screenLocation[0], secondWord.screenLocation[1]);
        screen.printString(thirdWord.text, thirdWord.screenLocation[0], thirdWord.screenLocation[1]);
        screen.printString(fourthWord.text, fourthWord.screenLocation[0], fourthWord.screenLocation[1]);

        screen.refreshScreen();
        usleep(MICROSECONDS_PER_SECOND / FRAMES_PER_SECOND);

        // Move the words
        firstWord.screenLocation[0] = calculateNewPosition(firstWord.screenLocation[0],
                                                          animationLength,
                                                          firstWordStartLocation[0],
                                                          firstWordEndLocation[0],
                                                           DOWN);
        firstWord.screenLocation[1] = calculateNewPosition(firstWord.screenLocation[1],
                                                           animationLength,
                                                           firstWordStartLocation[1],
                                                           firstWordEndLocation[1],
                                                           LEFT);
        secondWord.screenLocation[0] = calculateNewPosition(secondWord.screenLocation[0],
                                                           animationLength,
                                                           secondWordStartLocation[0],
                                                           secondWordEndLocation[0],
                                                            DOWN);
        secondWord.screenLocation[1] = calculateNewPosition(secondWord.screenLocation[1],
                                                           animationLength,
                                                           secondWordStartLocation[1],
                                                           secondWordEndLocation[1],
                                                            RIGHT);
        thirdWord.screenLocation[0] = calculateNewPosition(thirdWord.screenLocation[0],
                                                           animationLength,
                                                           thirdWordStartLocation[0],
                                                           thirdWordEndLocation[0],
                                                            UP);
        thirdWord.screenLocation[1] = calculateNewPosition(thirdWord.screenLocation[1],
                                                           animationLength,
                                                           thirdWordStartLocation[1],
                                                           thirdWordEndLocation[1],
                                                           LEFT);
        fourthWord.screenLocation[0] = calculateNewPosition(fourthWord.screenLocation[0],
                                                           animationLength,
                                                           fourthWordStartLocation[0],
                                                           fourthWordEndLocation[0],
                                                            UP);
        fourthWord.screenLocation[1] = calculateNewPosition(fourthWord.screenLocation[1],
                                                           animationLength,
                                                           fourthWordStartLocation[1],
                                                           fourthWordEndLocation[1],
                                                            RIGHT);
        frameCounter++;
    }

    // Turn off the color attribute
    //screen.turnAttrOff(COLOR_PAIR(color));
}